

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

string * libtorrent::aux::get_symlink_path(string *__return_storage_ptr__,string *p)

{
  undefined1 auVar1 [16];
  string *p_local;
  
  auVar1 = ::std::__cxx11::string::c_str();
  libtorrent::(anonymous_namespace)::get_symlink_path_impl_abi_cxx11_
            (__return_storage_ptr__,auVar1._0_8_,auVar1._8_8_);
  return __return_storage_ptr__;
}

Assistant:

std::string get_symlink_path(std::string const& p)
	{
#if defined TORRENT_WINDOWS
		TORRENT_UNUSED(p);
		return "";
#else
		return get_symlink_path_impl(p.c_str());
#endif
	}